

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

int __thiscall Map<int,_int>::remove(Map<int,_int> *this,char *__filename)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  Iterator local_20;
  Iterator it;
  int *key_local;
  Map<int,_int> *this_local;
  
  it.item = (Item *)__filename;
  local_20 = find(this,(int *)__filename);
  bVar1 = Iterator::operator!=(&local_20,&this->_end);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    iVar2 = remove(this,(char *)&local_20);
  }
  return iVar2;
}

Assistant:

void remove(const T& key)
  {
    Iterator it = find(key);
    if(it != _end)
      remove(it);
  }